

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# StrikeRegister.cpp
# Opt level: O0

Counter64 __thiscall
security::StrikeRegister::Expand(StrikeRegister *this,uint64_t partial,uint bytes)

{
  uint uVar1;
  int in_ECX;
  unsigned_long in_RDX;
  long in_RSI;
  Counter<unsigned_long,_64U> *in_RDI;
  int8_t gap;
  int16_t gap_1;
  SignedType gapSigned;
  ValueType_conflict gapMSB;
  ValueType gap_2;
  ValueType smallRecent;
  SignedType smallerSigned;
  ValueType_conflict smallerMSB;
  int32_t gap_3;
  SignedType gapSigned_1;
  ValueType_conflict gapMSB_1;
  ValueType_conflict gap_4;
  ValueType_conflict smallRecent_1;
  SignedType smallerSigned_1;
  ValueType_conflict smallerMSB_1;
  SignedType gapSigned_2;
  ValueType_conflict gapMSB_2;
  ValueType_conflict gap_5;
  ValueType_conflict smallRecent_2;
  SignedType smallerSigned_2;
  ValueType_conflict smallerMSB_2;
  SignedType gapSigned_3;
  ValueType_conflict gapMSB_3;
  ValueType_conflict gap_6;
  ValueType_conflict smallRecent_3;
  SignedType smallerSigned_3;
  ValueType_conflict smallerMSB_3;
  Counter<unsigned_long,_56U> local_268;
  Counter<unsigned_long,_64U> local_260;
  Counter<unsigned_long,_48U> local_258;
  Counter<unsigned_long,_64U> local_250;
  Counter<unsigned_long,_40U> local_248;
  Counter<unsigned_long,_64U> local_240;
  Counter<unsigned_int,_32U> local_234;
  Counter<unsigned_long,_64U> local_230;
  Counter<unsigned_int,_24U> local_224;
  Counter<unsigned_long,_64U> local_220;
  Counter<unsigned_short,_16U> local_212;
  Counter<unsigned_long,_64U> local_210;
  Counter<unsigned_char,_8U> local_201;
  Counter<unsigned_long,_64U> local_200 [2];
  unsigned_long local_1f0;
  unsigned_long local_1e8;
  Counter<unsigned_long,_64U> local_1d8;
  char local_1c9;
  Counter<unsigned_char,_8U> *local_1c8;
  Counter<unsigned_long,_64U> *local_1c0;
  Counter<unsigned_long,_64U> local_1b0;
  short local_1a2;
  Counter<unsigned_short,_16U> *local_1a0;
  Counter<unsigned_long,_64U> *local_198;
  long local_188;
  ulong local_180;
  uint local_178;
  uint local_174;
  long local_170;
  ulong local_168;
  Counter<unsigned_int,_24U> *local_160;
  Counter<unsigned_long,_64U> *local_158;
  Counter<unsigned_long,_64U> local_148;
  int local_13c;
  Counter<unsigned_int,_32U> *local_138;
  Counter<unsigned_long,_64U> *local_130;
  long local_120;
  ulong local_118;
  ulong local_110;
  ulong local_108;
  long local_100;
  ulong local_f8;
  Counter<unsigned_long,_40U> *local_f0;
  Counter<unsigned_long,_64U> *local_e8;
  long local_d8;
  ulong local_d0;
  ulong local_c8;
  ulong local_c0;
  long local_b8;
  ulong local_b0;
  Counter<unsigned_long,_48U> *local_a8;
  Counter<unsigned_long,_64U> *local_a0;
  long local_90;
  ulong local_88;
  ulong local_80;
  ulong local_78;
  long local_70;
  ulong local_68;
  Counter<unsigned_long,_56U> *local_60;
  Counter<unsigned_long,_64U> *local_58;
  Counter<unsigned_long,_64U> *local_48;
  Counter<unsigned_long,_64U> *local_40;
  Counter<unsigned_long,_64U> *local_30;
  Counter<unsigned_long,_64U> *local_28;
  Counter<unsigned_long,_64U> *local_18;
  Counter<unsigned_long,_64U> *local_10;
  
  local_1e8 = *(unsigned_long *)(in_RSI + 0x210);
  if (in_ECX - 1U < 6 || in_ECX == 7) {
    local_1f0 = in_RDX;
    switch((long)&switchD_00161b24::switchdataD_00275d60 +
           (long)(int)(&switchD_00161b24::switchdataD_00275d60)[in_ECX - 1U]) {
    case 0x161b26:
      Counter<unsigned_long,_64U>::Counter(local_200,local_1e8);
      Counter<unsigned_char,_8U>::Counter(&local_201,(uchar)local_1f0);
      local_1c0 = local_200;
      local_1c8 = &local_201;
      local_1c9 = local_201.Value - (char)local_200[0].Value;
      Counter<unsigned_long,_64U>::Counter(&local_1d8,(long)local_1c9);
      local_10 = local_200;
      local_18 = &local_1d8;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_200[0].Value + local_1d8.Value);
      break;
    case 0x161bfc:
      Counter<unsigned_long,_64U>::Counter(&local_210,local_1e8);
      Counter<unsigned_short,_16U>::Counter(&local_212,(unsigned_short)local_1f0);
      local_198 = &local_210;
      local_1a0 = &local_212;
      local_1a2 = local_212.Value - (short)local_210.Value;
      Counter<unsigned_long,_64U>::Counter(&local_1b0,(long)local_1a2);
      local_28 = &local_210;
      local_30 = &local_1b0;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_210.Value + local_1b0.Value);
      break;
    case 0x161cd3:
      Counter<unsigned_long,_64U>::Counter(&local_220,local_1e8);
      Counter<unsigned_int,_24U>::Counter(&local_224,(uint)local_1f0);
      local_158 = &local_220;
      local_160 = &local_224;
      local_168 = (ulong)(local_224.Value & 0x800000);
      local_170 = (ulong)local_224.Value + local_168 * -2;
      local_174 = (uint)local_220.Value & 0xffffff;
      uVar1 = (int)local_170 - local_174;
      local_178 = uVar1 & 0xffffff;
      local_180 = (ulong)(uVar1 & 0x800000);
      local_188 = (ulong)local_178 + local_180 * -2;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_220.Value + local_188);
      break;
    case 0x161ddf:
      Counter<unsigned_long,_64U>::Counter(&local_230,local_1e8);
      Counter<unsigned_int,_32U>::Counter(&local_234,(uint)local_1f0);
      local_130 = &local_230;
      local_138 = &local_234;
      local_13c = local_234.Value - (int)local_230.Value;
      Counter<unsigned_long,_64U>::Counter(&local_148,(long)local_13c);
      local_40 = &local_230;
      local_48 = &local_148;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_230.Value + local_148.Value);
      break;
    case 0x161eaf:
      Counter<unsigned_long,_64U>::Counter(&local_240,local_1e8);
      Counter<unsigned_long,_40U>::Counter(&local_248,local_1f0);
      local_e8 = &local_240;
      local_f0 = &local_248;
      local_f8 = local_248.Value & 0x8000000000;
      local_100 = local_248.Value + local_f8 * -2;
      local_108 = local_240.Value & 0xffffffffff;
      local_110 = local_100 - local_108 & 0xffffffffff;
      local_118 = local_100 - local_108 & 0x8000000000;
      local_120 = local_110 + local_118 * -2;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_240.Value + local_120);
      break;
    case 0x161fb7:
      Counter<unsigned_long,_64U>::Counter(&local_250,local_1e8);
      Counter<unsigned_long,_48U>::Counter(&local_258,local_1f0);
      local_a0 = &local_250;
      local_a8 = &local_258;
      local_b0 = local_258.Value & 0x800000000000;
      local_b8 = local_258.Value + local_b0 * -2;
      local_c0 = local_250.Value & 0xffffffffffff;
      local_c8 = local_b8 - local_c0 & 0xffffffffffff;
      local_d0 = local_b8 - local_c0 & 0x800000000000;
      local_d8 = local_c8 + local_d0 * -2;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_250.Value + local_d8);
      break;
    case 0x1620bf:
      Counter<unsigned_long,_64U>::Counter(&local_260,local_1e8);
      Counter<unsigned_long,_56U>::Counter(&local_268,local_1f0);
      local_58 = &local_260;
      local_60 = &local_268;
      local_68 = local_268.Value & 0x80000000000000;
      local_70 = local_268.Value + local_68 * -2;
      local_78 = local_260.Value & 0xffffffffffffff;
      local_80 = local_70 - local_78 & 0xffffffffffffff;
      local_88 = local_70 - local_78 & 0x80000000000000;
      local_90 = local_80 + local_88 * -2;
      Counter<unsigned_long,_64U>::Counter(in_RDI,local_260.Value + local_90);
    }
  }
  else {
    Counter<unsigned_long,_64U>::Counter(in_RDI,0);
  }
  return (Counter64)(unsigned_long)in_RDI;
}

Assistant:

Counter64 StrikeRegister::Expand(uint64_t partial, unsigned bytes) const
{
    SECURITY_DEBUG_ASSERT(bytes > 0 && bytes < 8);
    return CounterExpand(LargestSequence.ToUnsigned(), partial, bytes);
}